

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::submit::submit(submit *this)

{
  string local_38;
  
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0xc0);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"submit","");
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__002872f8,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)0x287220;
  *(undefined8 *)&(this->super_base_html_input).field_0xc0 = 0x2872a0;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0;
  (this->super_base_html_input).field_0x38 = 0;
  *(undefined4 *)&(this->super_base_html_input).field_0x40 = 0;
  *(undefined8 *)&(this->super_base_html_input).field_0x48 = 0;
  *(undefined8 *)&(this->super_base_html_input).field_0x50 = 0;
  *(undefined8 *)&(this->super_base_html_input).field_0x58 = 0;
  *(undefined1 **)&(this->super_base_html_input).field_0x60 =
       &(this->super_base_html_input).field_0x70;
  *(undefined8 *)&(this->super_base_html_input).field_0x68 = 0;
  (this->super_base_html_input).field_0x70 = 0;
  *(undefined1 **)&(this->super_base_html_input).field_0x80 =
       &(this->super_base_html_input).field_0x90;
  *(undefined8 *)&(this->super_base_html_input).field_0x88 = 0;
  (this->super_base_html_input).field_0x90 = 0;
  *(undefined1 **)&(this->super_base_html_input).field_0xa0 =
       &(this->super_base_html_input).field_0xb0;
  *(undefined8 *)&(this->super_base_html_input).field_0xa8 = 0;
  (this->super_base_html_input).field_0xb0 = 0;
  this->field_0x2b0 = this->field_0x2b0 | 2;
  return;
}

Assistant:

submit::submit() : 
	base_html_input("submit"),
	pressed_(false)
{
	set(true);
}